

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_delta_lflevel(AV1_COMMON *cm,aom_reader *r,aom_cdf_prob *cdf,MB_MODE_INFO *mbmi,int mi_col,
                      int mi_row)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = (mi_col | mi_row) & cm->seq_params->mib_size - 1U;
  if (mbmi->bsize == cm->seq_params->sb_size) {
    if (mbmi->skip_txfm != '\0') {
      return 0;
    }
    if (uVar3 != 0) {
      return 0;
    }
  }
  else if (uVar3 != 0) {
    return 0;
  }
  iVar1 = aom_read_symbol_(r,cdf,4);
  if (2 < iVar1) {
    iVar1 = aom_read_literal_(r,3);
    iVar2 = aom_read_literal_(r,iVar1 + 1);
    iVar1 = iVar2 + (1 << ((byte)(iVar1 + 1) & 0x1f)) + 1;
  }
  if (iVar1 == 0) {
    return 0;
  }
  iVar2 = aom_read_bit_(r);
  if (iVar2 == 0) {
    return iVar1;
  }
  return -iVar1;
}

Assistant:

static int read_delta_lflevel(const AV1_COMMON *const cm, aom_reader *r,
                              aom_cdf_prob *const cdf,
                              const MB_MODE_INFO *const mbmi, int mi_col,
                              int mi_row) {
  int reduced_delta_lflevel = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int b_col = mi_col & (cm->seq_params->mib_size - 1);
  const int b_row = mi_row & (cm->seq_params->mib_size - 1);
  const int read_delta_lf_flag = (b_col == 0 && b_row == 0);

  if ((bsize != cm->seq_params->sb_size || mbmi->skip_txfm == 0) &&
      read_delta_lf_flag) {
    int abs = aom_read_symbol(r, cdf, DELTA_LF_PROBS + 1, ACCT_STR);
    const int smallval = (abs < DELTA_LF_SMALL);
    if (!smallval) {
      const int rem_bits = aom_read_literal(r, 3, ACCT_STR) + 1;
      const int thr = (1 << rem_bits) + 1;
      abs = aom_read_literal(r, rem_bits, ACCT_STR) + thr;
    }
    const int sign = abs ? aom_read_bit(r, ACCT_STR) : 1;
    reduced_delta_lflevel = sign ? -abs : abs;
  }
  return reduced_delta_lflevel;
}